

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O1

RTCScene rtcNewScene(RTCDevice hdevice)

{
  int iVar1;
  Scene *this;
  undefined4 extraout_var;
  undefined8 *puVar2;
  DeviceEnterLeave enterleave;
  DeviceEnterLeave local_50;
  long local_48;
  
  if (hdevice != (RTCDevice)0x0) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&local_50,hdevice);
    this = (Scene *)embree::alignedMalloc(0x350,0x10);
    embree::Scene::Scene(this,(Device *)hdevice);
    iVar1 = (*(this->super_AccelN).super_Accel.super_AccelData.super_RefCount._vptr_RefCount[2])
                      (this);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&local_50);
    return (RTCScene)CONCAT44(extraout_var,iVar1);
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_50.device = (Device *)&stack0xffffffffffffffc0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invalid argument","");
  *puVar2 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar2 + 1) = 2;
  puVar2[2] = puVar2 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 2),local_50.device,
             (undefined1 *)
             ((long)&((local_50.device)->super_State).super_RefCount._vptr_RefCount + local_48));
  __cxa_throw(puVar2,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API RTCScene rtcNewScene (RTCDevice hdevice) 
  {
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcNewScene);
    RTC_VERIFY_HANDLE(hdevice);
    RTC_ENTER_DEVICE(hdevice);
    Scene* scene = new Scene((Device*)hdevice);
    return (RTCScene) scene->refInc();
    RTC_CATCH_END((Device*)hdevice);
    return nullptr;
  }